

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix-det.cpp
# Opt level: O3

int main(void)

{
  void *pvVar1;
  T TVar2;
  long lVar3;
  initializer_list<long_long> __l;
  initializer_list<long_long> __l_00;
  initializer_list<long_long> __l_01;
  initializer_list<std::vector<long_long,_std::allocator<long_long>_>_> __l_02;
  initializer_list<long_long> __l_03;
  initializer_list<long_long> __l_04;
  initializer_list<std::vector<long_long,_std::allocator<long_long>_>_> __l_05;
  initializer_list<long_long> __l_06;
  initializer_list<long_long> __l_07;
  initializer_list<std::vector<long_long,_std::allocator<long_long>_>_> __l_08;
  Matrix out;
  Matrix c;
  Matrix a;
  Matrix b;
  allocator_type local_db;
  allocator_type local_da;
  allocator_type local_d9;
  vector<long_long,_std::allocator<long_long>_> local_d8;
  vector<long_long,_std::allocator<long_long>_> local_c0;
  vector<long_long,_std::allocator<long_long>_> local_a8;
  vector<long_long,_std::allocator<long_long>_> local_90;
  vector<std::vector<long_long,_std::allocator<long_long>_>,_std::allocator<std::vector<long_long,_std::allocator<long_long>_>_>_>
  local_78;
  longlong local_60 [2];
  vector<std::vector<long_long,_std::allocator<long_long>_>,_std::allocator<std::vector<long_long,_std::allocator<long_long>_>_>_>
  local_50;
  vector<std::vector<long_long,_std::allocator<long_long>_>,_std::allocator<std::vector<long_long,_std::allocator<long_long>_>_>_>
  local_38;
  
  local_38.
  super__Vector_base<std::vector<long_long,_std::allocator<long_long>_>,_std::allocator<std::vector<long_long,_std::allocator<long_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x1;
  local_38.
  super__Vector_base<std::vector<long_long,_std::allocator<long_long>_>,_std::allocator<std::vector<long_long,_std::allocator<long_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x2;
  local_38.
  super__Vector_base<std::vector<long_long,_std::allocator<long_long>_>,_std::allocator<std::vector<long_long,_std::allocator<long_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x3;
  __l._M_len = 3;
  __l._M_array = (iterator)&local_38;
  std::vector<long_long,_std::allocator<long_long>_>::vector
            (&local_c0,__l,(allocator_type *)local_60);
  local_78.
  super__Vector_base<std::vector<long_long,_std::allocator<long_long>_>,_std::allocator<std::vector<long_long,_std::allocator<long_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x4;
  local_78.
  super__Vector_base<std::vector<long_long,_std::allocator<long_long>_>,_std::allocator<std::vector<long_long,_std::allocator<long_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x5;
  local_78.
  super__Vector_base<std::vector<long_long,_std::allocator<long_long>_>,_std::allocator<std::vector<long_long,_std::allocator<long_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x6;
  __l_00._M_len = 3;
  __l_00._M_array = (iterator)&local_78;
  std::vector<long_long,_std::allocator<long_long>_>::vector(&local_a8,__l_00,&local_db);
  local_d8.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x7;
  local_d8.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x8;
  local_d8.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x9;
  __l_01._M_len = 3;
  __l_01._M_array = (iterator)&local_d8;
  std::vector<long_long,_std::allocator<long_long>_>::vector(&local_90,__l_01,&local_da);
  __l_02._M_len = 3;
  __l_02._M_array = &local_c0;
  std::
  vector<std::vector<long_long,_std::allocator<long_long>_>,_std::allocator<std::vector<long_long,_std::allocator<long_long>_>_>_>
  ::vector(&local_50,__l_02,&local_d9);
  lVar3 = 0x30;
  do {
    pvVar1 = *(void **)((long)&local_c0.super__Vector_base<long_long,_std::allocator<long_long>_>.
                               _M_impl.super__Vector_impl_data._M_start + lVar3);
    if (pvVar1 != (void *)0x0) {
      operator_delete(pvVar1);
    }
    lVar3 = lVar3 + -0x18;
  } while (lVar3 != -0x18);
  local_78.
  super__Vector_base<std::vector<long_long,_std::allocator<long_long>_>,_std::allocator<std::vector<long_long,_std::allocator<long_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x7;
  local_78.
  super__Vector_base<std::vector<long_long,_std::allocator<long_long>_>,_std::allocator<std::vector<long_long,_std::allocator<long_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x8;
  __l_03._M_len = 2;
  __l_03._M_array = (iterator)&local_78;
  std::vector<long_long,_std::allocator<long_long>_>::vector
            (&local_c0,__l_03,(allocator_type *)local_60);
  local_d8.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x9;
  local_d8.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0xa;
  __l_04._M_len = 2;
  __l_04._M_array = (iterator)&local_d8;
  std::vector<long_long,_std::allocator<long_long>_>::vector(&local_a8,__l_04,&local_db);
  __l_05._M_len = 2;
  __l_05._M_array = &local_c0;
  std::
  vector<std::vector<long_long,_std::allocator<long_long>_>,_std::allocator<std::vector<long_long,_std::allocator<long_long>_>_>_>
  ::vector(&local_38,__l_05,(allocator_type *)&local_da);
  lVar3 = 0x18;
  do {
    pvVar1 = *(void **)((long)&local_c0.super__Vector_base<long_long,_std::allocator<long_long>_>.
                               _M_impl.super__Vector_impl_data._M_start + lVar3);
    if (pvVar1 != (void *)0x0) {
      operator_delete(pvVar1);
    }
    lVar3 = lVar3 + -0x18;
  } while (lVar3 != -0x18);
  local_d8.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x3a;
  local_d8.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x40;
  __l_06._M_len = 2;
  __l_06._M_array = (iterator)&local_d8;
  std::vector<long_long,_std::allocator<long_long>_>::vector(&local_c0,__l_06,&local_db);
  local_60[0] = 0x8b;
  local_60[1] = 0x9a;
  __l_07._M_len = 2;
  __l_07._M_array = local_60;
  std::vector<long_long,_std::allocator<long_long>_>::vector(&local_a8,__l_07,&local_da);
  __l_08._M_len = 2;
  __l_08._M_array = &local_c0;
  std::
  vector<std::vector<long_long,_std::allocator<long_long>_>,_std::allocator<std::vector<long_long,_std::allocator<long_long>_>_>_>
  ::vector(&local_78,__l_08,&local_d9);
  lVar3 = 0x18;
  do {
    pvVar1 = *(void **)((long)&local_c0.super__Vector_base<long_long,_std::allocator<long_long>_>.
                               _M_impl.super__Vector_impl_data._M_start + lVar3);
    if (pvVar1 != (void *)0x0) {
      operator_delete(pvVar1);
    }
    lVar3 = lVar3 + -0x18;
  } while (lVar3 != -0x18);
  std::vector<long_long,_std::allocator<long_long>_>::vector
            (&local_d8,
             (long)((local_50.
                     super__Vector_base<std::vector<long_long,_std::allocator<long_long>_>,_std::allocator<std::vector<long_long,_std::allocator<long_long>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->
                   super__Vector_base<long_long,_std::allocator<long_long>_>)._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)((local_50.
                     super__Vector_base<std::vector<long_long,_std::allocator<long_long>_>,_std::allocator<std::vector<long_long,_std::allocator<long_long>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->
                   super__Vector_base<long_long,_std::allocator<long_long>_>)._M_impl.
                   super__Vector_impl_data._M_start >> 3,(allocator_type *)local_60);
  std::
  vector<std::vector<long_long,_std::allocator<long_long>_>,_std::allocator<std::vector<long_long,_std::allocator<long_long>_>_>_>
  ::vector((vector<std::vector<long_long,_std::allocator<long_long>_>,_std::allocator<std::vector<long_long,_std::allocator<long_long>_>_>_>
            *)&local_c0,
           ((long)local_50.
                  super__Vector_base<std::vector<long_long,_std::allocator<long_long>_>,_std::allocator<std::vector<long_long,_std::allocator<long_long>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)local_50.
                  super__Vector_base<std::vector<long_long,_std::allocator<long_long>_>,_std::allocator<std::vector<long_long,_std::allocator<long_long>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555,&local_d8,
           (allocator_type *)&local_db);
  if (local_d8.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_d8.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  TVar2 = det(&local_50);
  if (TVar2 != 0) {
    __assert_fail("det(a) == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/drathier[P]compprogcheatsheet/code/math/matrix-det.cpp"
                  ,0x29,"int main()");
  }
  TVar2 = det(&local_38);
  if (TVar2 != -2) {
    __assert_fail("det(b) == -2",
                  "/workspace/llm4binary/github/license_c_cmakelists/drathier[P]compprogcheatsheet/code/math/matrix-det.cpp"
                  ,0x2a,"int main()");
  }
  TVar2 = det(&local_78);
  if (TVar2 == 0x24) {
    std::
    vector<std::vector<long_long,_std::allocator<long_long>_>,_std::allocator<std::vector<long_long,_std::allocator<long_long>_>_>_>
    ::~vector((vector<std::vector<long_long,_std::allocator<long_long>_>,_std::allocator<std::vector<long_long,_std::allocator<long_long>_>_>_>
               *)&local_c0);
    std::
    vector<std::vector<long_long,_std::allocator<long_long>_>,_std::allocator<std::vector<long_long,_std::allocator<long_long>_>_>_>
    ::~vector(&local_78);
    std::
    vector<std::vector<long_long,_std::allocator<long_long>_>,_std::allocator<std::vector<long_long,_std::allocator<long_long>_>_>_>
    ::~vector(&local_38);
    std::
    vector<std::vector<long_long,_std::allocator<long_long>_>,_std::allocator<std::vector<long_long,_std::allocator<long_long>_>_>_>
    ::~vector(&local_50);
    return 0;
  }
  __assert_fail("det(c) == 36",
                "/workspace/llm4binary/github/license_c_cmakelists/drathier[P]compprogcheatsheet/code/math/matrix-det.cpp"
                ,0x2b,"int main()");
}

Assistant:

int main() {
	Matrix a({{1, 2, 3},
						 {4, 5, 6},
						 {7, 8, 9}});
	Matrix b({{7, 8},
						 {9, 10}});
	Matrix c({{58,  64},
						 {139, 154}});
	Matrix out(a.size(), Row(a[0].size()));

	assert(det(a) == 0);
	assert(det(b) == -2);
	assert(det(c) == 36);

	return 0;
}